

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utFBXImporterExporter.cpp
# Opt level: O3

void __thiscall
utFBXImporterExporter_importCubesWithUnicodeDuplicatedNames_Test::TestBody
          (utFBXImporterExporter_importCubesWithUnicodeDuplicatedNames_Test *this)

{
  aiNode *paVar1;
  aiNode *paVar2;
  aiScene *paVar3;
  string *this_00;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Importer importer;
  AssertHelper local_60;
  undefined1 local_58 [24];
  string local_40;
  Importer local_20;
  
  Assimp::Importer::Importer(&local_20);
  paVar3 = Assimp::Importer::ReadFile
                     (&local_20,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/FBX/cubes_with_names.fbx"
                      ,0x400);
  local_58[0] = paVar3 != (aiScene *)0x0;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (paVar3 == (aiScene *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)0x75d030,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x72,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar5 = paVar3->mRootNode == (aiNode *)0x0;
  local_58[0] = !bVar5;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)"scene->mRootNode","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x74,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar1 = paVar3->mRootNode;
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_40,"root->mName.C_Str()","\"RootNode\"",(paVar1->mName).data,
             "RootNode");
  if (local_40._M_dataplus._M_p._0_1_ == '\0') {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x76,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58._4_4_,local_58._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar5 = paVar1->mChildren == (aiNode **)0x0;
  local_58[0] = !bVar5;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)"root->mChildren","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x77,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_40,"root->mNumChildren","2u",&paVar1->mNumChildren,(uint *)local_58)
  ;
  if (local_40._M_dataplus._M_p._0_1_ == '\0') {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x78,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58._4_4_,local_58._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar2 = *paVar1->mChildren;
  local_58[0] = paVar2 != (aiNode *)0x0;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (paVar2 == (aiNode *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)"child0","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x7b,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_40,"child0->mName.C_Str()","\"Cube2\"",(paVar2->mName).data,"Cube2")
  ;
  if (local_40._M_dataplus._M_p._0_1_ == '\0') {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x7c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58._4_4_,local_58._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar5 = paVar2->mChildren == (aiNode **)0x0;
  local_58[0] = !bVar5;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)"child0->mChildren","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x7d,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_58._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_40,"child0->mNumChildren","1u",&paVar2->mNumChildren,
             (uint *)local_58);
  if (local_40._M_dataplus._M_p._0_1_ == '\0') {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x7e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58._4_4_,local_58._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar2 = *paVar2->mChildren;
  local_58[0] = paVar2 != (aiNode *)0x0;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (paVar2 == (aiNode *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)"child00","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x81,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_40,"child00->mName.C_Str()",
             "\"\\xd0\\x9a\\xd1\\x83\\xd0\\xb1\\x31\"",(paVar2->mName).data,anon_var_dwarf_1db4c5);
  if (local_40._M_dataplus._M_p._0_1_ == '\0') {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x82,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_58._4_4_,local_58._0_4_) != 0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && ((long *)CONCAT44(local_58._4_4_,local_58._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_58._4_4_,local_58._0_4_) + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar1 = paVar1->mChildren[1];
  local_58[0] = paVar1 != (aiNode *)0x0;
  local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (paVar1 == (aiNode *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)"child1","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x85,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      bVar5 = testing::internal::IsTrue(true);
      if ((bVar5) && (local_60.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_60.data_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    goto LAB_00353e49;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_58 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_40,"child1->mName.C_Str()","\"Cube3\"",(paVar1->mName).data,"Cube3")
  ;
  if (local_40._M_dataplus._M_p._0_1_ == '\0') {
    testing::Message::Message((Message *)local_58);
    if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_40._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
LAB_00353e2b:
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)local_58);
LAB_00353e3f:
    this_00 = &local_40;
  }
  else {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_40);
    bVar5 = paVar1->mChildren != (aiNode **)0x0;
    local_58[0] = bVar5;
    local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar5) {
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
      local_58._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&local_40,"child1->mNumChildren","1u",&paVar1->mNumChildren,
                 (uint *)local_58);
      if (local_40._M_dataplus._M_p._0_1_ == '\0') {
        testing::Message::Message((Message *)local_58);
        if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_40._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0x88,pcVar4);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
        goto LAB_00353e2b;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_40);
      paVar1 = *paVar1->mChildren;
      local_58[0] = paVar1 != (aiNode *)0x0;
      local_58._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (paVar1 == (aiNode *)0x0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_40,(internal *)local_58,(AssertionResult *)"child10","false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0x8b,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                          local_40._M_dataplus._M_p._0_1_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
        goto LAB_00353d99;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_40,"child10->mName.C_Str()",
                 "\"\\xd0\\x9a\\xd1\\x83\\xd0\\xb1\\x31\"\"001\"",(paVar1->mName).data,
                 anon_var_dwarf_1db4f9);
      if (local_40._M_dataplus._M_p._0_1_ == '\0') {
        testing::Message::Message((Message *)local_58);
        if ((undefined8 *)local_40._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_40._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
                   ,0x8c,pcVar4);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)local_58);
        goto LAB_00353e2b;
      }
      goto LAB_00353e3f;
    }
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)local_58,(AssertionResult *)"child1->mChildren","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_58 + 0x10),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utFBXImporterExporter.cpp"
               ,0x87,(char *)CONCAT71(local_40._M_dataplus._M_p._1_7_,
                                      local_40._M_dataplus._M_p._0_1_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(local_58 + 0x10),(Message *)&local_60);
LAB_00353d99:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_) !=
        &local_40.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_40._M_dataplus._M_p._1_7_,local_40._M_dataplus._M_p._0_1_));
    }
    testing::Message::~Message((Message *)&local_60);
    this_00 = (string *)local_58;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)this_00);
LAB_00353e49:
  Assimp::Importer::~Importer(&local_20);
  return;
}

Assistant:

TEST_F(utFBXImporterExporter, importCubesWithUnicodeDuplicatedNames) {
    Assimp::Importer importer;
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/FBX/cubes_with_names.fbx", aiProcess_ValidateDataStructure);
    ASSERT_TRUE(scene);

    ASSERT_TRUE(scene->mRootNode);
    const auto root = scene->mRootNode;
    ASSERT_STREQ(root->mName.C_Str(), "RootNode");
    ASSERT_TRUE(root->mChildren);
    ASSERT_EQ(root->mNumChildren, 2u);

    const auto child0 = root->mChildren[0];
    ASSERT_TRUE(child0);
    ASSERT_STREQ(child0->mName.C_Str(), "Cube2");
    ASSERT_TRUE(child0->mChildren);
    ASSERT_EQ(child0->mNumChildren, 1u);

    const auto child00 = child0->mChildren[0];
    ASSERT_TRUE(child00);
    ASSERT_STREQ(child00->mName.C_Str(), "\xd0\x9a\xd1\x83\xd0\xb1\x31");

    const auto child1 = root->mChildren[1];
    ASSERT_TRUE(child1);
    ASSERT_STREQ(child1->mName.C_Str(), "Cube3");
    ASSERT_TRUE(child1->mChildren);
    ASSERT_EQ(child1->mNumChildren, 1u);

    const auto child10 = child1->mChildren[0];
    ASSERT_TRUE(child10);
    ASSERT_STREQ(child10->mName.C_Str(), "\xd0\x9a\xd1\x83\xd0\xb1\x31""001");
}